

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O3

uint32_t __thiscall
wirehair::Codec::Encode(Codec *this,uint32_t block_id,void *block_out,uint32_t out_buffer_bytes)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint bytes;
  uint8_t *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  Codec *pCVar11;
  uint i;
  long lVar12;
  uint uVar13;
  short sVar14;
  RowMixIterator mix;
  PeelRowParameters params;
  ushort auStack_40 [3];
  PeelRowParameters local_3a;
  
  uVar7 = 0;
  if (block_out != (void *)0x0) {
    uVar1 = this->_block_count;
    pCVar11 = (Codec *)&this->_input_final_bytes;
    if ((block_id & 0xffff) != uVar1 - 1) {
      pCVar11 = this;
    }
    bytes = pCVar11->_block_bytes;
    if (bytes <= out_buffer_bytes) {
      uVar7 = bytes;
      if ((block_id < uVar1) && (this->_original_out_of_order == false)) {
        memcpy(block_out,this->_input_blocks + block_id * this->_block_bytes,(ulong)bytes);
      }
      else {
        PeelRowParameters::Initialize(&local_3a,block_id,this->_p_seed,uVar1,this->_mix_count);
        uVar9 = (ulong)local_3a.MixFirst;
        uVar1 = this->_block_next_prime;
        uVar10 = (uint)local_3a.PeelAdd;
        uVar2 = this->_mix_count;
        uVar3 = this->_mix_next_prime;
        lVar12 = 1;
        uVar5 = (uint)this->_block_count;
        do {
          uVar9 = (ulong)(((uint)uVar9 & 0xffff) + (uint)local_3a.MixAdd) % (ulong)uVar3;
          if ((uint)uVar2 <= (uint)uVar9) {
            uVar6 = (uint)uVar3 - (uint)uVar9;
            uVar13 = uVar6 & 0xffff;
            if (local_3a.MixAdd < (ushort)uVar6) {
              uVar9 = (ulong)((uint)local_3a.MixAdd * 0x10000 - uVar13) %
                      (ulong)(uint)local_3a.MixAdd;
            }
            else {
              uVar9 = (ulong)(local_3a.MixAdd - uVar13);
            }
          }
          auStack_40[lVar12] = (ushort)uVar9;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        uVar6 = this->_block_bytes;
        puVar4 = this->_recovery_blocks;
        if (local_3a.PeelCount == 1) {
          gf256_addset_mem(block_out,puVar4 + uVar6 * local_3a.PeelFirst,
                           puVar4 + (local_3a.MixFirst + uVar5) * uVar6,bytes);
        }
        else {
          sVar14 = local_3a.PeelCount - 2;
          uVar9 = (ulong)((uint)local_3a.PeelFirst + (uint)local_3a.PeelAdd) % (ulong)uVar1;
          if (uVar5 <= (uint)uVar9) {
            uVar13 = (uint)uVar1 - (uint)uVar9;
            uVar8 = uVar13 & 0xffff;
            if (local_3a.PeelAdd < (ushort)uVar13) {
              uVar9 = (ulong)(uVar10 * 0x10000 - uVar8) % (ulong)uVar10;
            }
            else {
              uVar9 = (ulong)(local_3a.PeelAdd - uVar8);
            }
          }
          gf256_addset_mem(block_out,puVar4 + uVar6 * local_3a.PeelFirst,
                           puVar4 + uVar6 * ((uint)uVar9 & 0xffff),bytes);
          if (sVar14 != 0) {
            do {
              uVar9 = (ulong)(((uint)uVar9 & 0xffff) + uVar10) % (ulong)uVar1;
              if (uVar5 <= (uint)uVar9) {
                uVar13 = (uint)uVar1 - (uint)uVar9;
                uVar8 = uVar13 & 0xffff;
                if (local_3a.PeelAdd < (ushort)uVar13) {
                  uVar9 = (ulong)(uVar10 * 0x10000 - uVar8) % (ulong)uVar10;
                }
                else {
                  uVar9 = (ulong)(uVar10 - uVar8);
                }
              }
              sVar14 = sVar14 + -1;
              gf256_add_mem(block_out,
                            this->_recovery_blocks + ((uint)uVar9 & 0xffff) * this->_block_bytes,
                            bytes);
            } while (sVar14 != 0);
          }
          gf256_add_mem(block_out,puVar4 + (local_3a.MixFirst + uVar5) * uVar6,bytes);
        }
        gf256_add2_mem(block_out,
                       this->_recovery_blocks +
                       ((uint)auStack_40[1] + (uint)this->_block_count) * this->_block_bytes,
                       this->_recovery_blocks +
                       ((uint)auStack_40[2] + (uint)this->_block_count) * this->_block_bytes,bytes);
      }
    }
  }
  return uVar7;
}

Assistant:

uint32_t Codec::Encode(
    const uint32_t block_id, ///< Block id to generate
    void * GF256_RESTRICT block_out, ///< Block data output
    uint32_t out_buffer_bytes ///< Bytes in block
)
{
    if (!block_out) {
        return 0;
    }

    unsigned copyBytes;

    // If this is the last block:
    if ((uint16_t)block_id == _block_count - 1) {
        copyBytes = _input_final_bytes;
    }
    else {
        copyBytes = _block_bytes;
    }

    // If not enough space in output buffer:
    if (out_buffer_bytes < copyBytes) {
        return 0;
    }

    uint8_t * GF256_RESTRICT data_out = reinterpret_cast<uint8_t *>( block_out );

#if defined(CAT_COPY_FIRST_N)
    // Note that if the encoder was a decoder the original message blocks may
    // not be available, so we regenerate them each time using the recovery set.
    // This means that wirehair_encode() after conversion will be slow for the
    // set of original blocks.  I noted this in the API comments to help devs.

    // For the original message blocks (id < N):
    if (block_id < _block_count &&
        !_original_out_of_order)
    {
        const uint8_t * GF256_RESTRICT src = _input_blocks + _block_bytes * block_id;

        // Copy from the original file data
        memcpy(data_out, src, copyBytes);
        return copyBytes;
    }
#endif // CAT_COPY_FIRST_N

    CAT_IF_DUMP(cout << "Encode: Generating row " << block_id << ":";)

    PeelRowParameters params;
    params.Initialize(block_id, _p_seed, _block_count, _mix_count);

    PeelRowIterator iter(params, _block_count, _block_next_prime);
    const RowMixIterator mix(params, _mix_count, _mix_next_prime);

    const uint16_t peel_0 = iter.GetColumn();

    // Remember first column (there is always at least one)
    CAT_DEBUG_ASSERT(peel_0 < _recovery_rows);
    const uint8_t * GF256_RESTRICT first = _recovery_blocks + _block_bytes * peel_0;

    CAT_IF_DUMP(cout << " " << peel_0;)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix0_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[0]);

    // If peeler has multiple columns:
    if (iter.Iterate())
    {
        const uint16_t peel_1 = iter.GetColumn();

        CAT_IF_DUMP(cout << " " << peel_1;)

        CAT_DEBUG_ASSERT(peel_1 < _recovery_rows);

        // Combine first two columns into output buffer (faster than memcpy + memxor)
        gf256_addset_mem(
            data_out,
            first,
            _recovery_blocks + _block_bytes * peel_1,
            copyBytes);

        // For each remaining peeler column:
        while (iter.Iterate())
        {
            const uint16_t peel_x = iter.GetColumn();

            CAT_IF_DUMP(cout << " " << peel_x;)

            CAT_DEBUG_ASSERT(peel_x < _recovery_rows);

            // Mix in each column
            gf256_add_mem(
                data_out,
                _recovery_blocks + _block_bytes * peel_x,
                copyBytes);
        }

        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first mixer block in directly
        gf256_add_mem(data_out, mix0_src, copyBytes);
    }
    else
    {
        CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[0]) < _recovery_rows);

        // Mix first with first mixer block (faster than memcpy + memxor)
        gf256_addset_mem(data_out, first, mix0_src, copyBytes);
    }

    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[0]);)

    // Add in remaining 2 mixer columns:

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[1]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix1_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[1]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[1]);)

    CAT_DEBUG_ASSERT((unsigned)(_block_count + mix.Columns[2]) < _recovery_rows);
    const uint8_t * GF256_RESTRICT mix2_src = _recovery_blocks + _block_bytes * (_block_count + mix.Columns[2]);
    CAT_IF_DUMP(cout << " " << (_block_count + mix.Columns[2]);)

    gf256_add2_mem(data_out, mix1_src, mix2_src, copyBytes);

    CAT_IF_DUMP(cout << endl;)

    return copyBytes;
}